

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Personality.cpp
# Opt level: O0

void __thiscall
Personality::Personality
          (Personality *this,string *n,int t,int spT,int c,int at,int def,int hon,int mf,int mi)

{
  string local_48 [32];
  int local_28;
  int local_24;
  int at_local;
  int c_local;
  int spT_local;
  int t_local;
  string *n_local;
  Personality *this_local;
  
  local_28 = at;
  local_24 = c;
  at_local = spT;
  c_local = t;
  _spT_local = n;
  n_local = (string *)this;
  std::__cxx11::string::string(local_48,(string *)n);
  BlackCard::BlackCard(&this->super_BlackCard,(string *)local_48,c_local);
  std::__cxx11::string::~string(local_48);
  (this->super_BlackCard).super_Card._vptr_Card = (_func_int **)&PTR_effectBonus_0012b2d8;
  std::__cxx11::string::string((string *)&this->name);
  std::__cxx11::list<Follower_*,_std::allocator<Follower_*>_>::list(&this->followers);
  std::__cxx11::list<Item_*,_std::allocator<Item_*>_>::list(&this->items);
  std::__cxx11::string::operator=((string *)&this->name,(string *)n);
  this->typeP = at_local;
  this->cost = local_24;
  this->tapped = false;
  this->revealed = false;
  this->attack = local_28;
  this->defense = def;
  this->honour = hon;
  this->dead = false;
  this->maxFollowers = mf;
  this->maxItems = mi;
  return;
}

Assistant:

Personality::Personality(string n, int t, int spT, int c, int at, int def, int hon, int mf, int mi) : BlackCard{n, t}
{
    name = n;
    typeP = Personalities(spT);

    cost = c;

    tapped = false;
    revealed = false;

    attack = at;
    defense = def;
    honour = hon;

    dead = false;

    maxFollowers = mf;
    maxItems = mi;
}